

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::QCalendarWidgetPrivate(QCalendarWidgetPrivate *this)

{
  QWidgetPrivate *in_RDI;
  
  QWidgetPrivate::QWidgetPrivate(in_RDI,(QtPrivate_6_10_0)((ulong)in_RDI >> 0x20));
  *(undefined ***)in_RDI = &PTR__QCalendarWidgetPrivate_00d100f0;
  QMap<int,_QAction_*>::QMap((QMap<int,_QAction_*> *)0x51b3c0);
  QSize::QSize((QSize *)in_RDI);
  *(undefined8 *)(in_RDI + 1) = 0;
  *(undefined8 *)&in_RDI[1].field_0x8 = 0;
  *(undefined8 *)&in_RDI[1].field_0x10 = 0;
  *(undefined8 *)&in_RDI[1].field_0x18 = 0;
  *(undefined8 *)&in_RDI[1].field_0x20 = 0;
  in_RDI[1].field_0x28 = 0;
  *(undefined1 *)
   &in_RDI[1].extra._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = 1;
  *(undefined4 *)((long)&in_RDI[1].focus_next + 4) = 0xb;
  return;
}

Assistant:

QCalendarWidgetPrivate::QCalendarWidgetPrivate()
    : QWidgetPrivate()
{
    m_model = nullptr;
    m_view = nullptr;
    m_delegate = nullptr;
    m_selection = nullptr;
    m_navigator = nullptr;
    m_dateEditEnabled = false;
    navBarVisible = true;
    oldFocusPolicy = Qt::StrongFocus;
}